

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

BCPos bcemit_branch(FuncState *fs,ExpDesc *e,int cond)

{
  BCPos BVar1;
  uint uVar2;
  int in_EDX;
  uint *in_RSI;
  FuncState *in_RDI;
  BCIns *ip;
  BCPos pc;
  ExpDesc *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((in_RSI[2] == 0xb) &&
     (in_stack_ffffffffffffffd8 = (ExpDesc *)(in_RDI->bcbase + *in_RSI),
     ((in_stack_ffffffffffffffd8->u).s.info & 0xff) == 0x13)) {
    uVar2 = 0xe;
    if (in_EDX != 0) {
      uVar2 = 0xf;
    }
    (in_stack_ffffffffffffffd8->u).s.info =
         uVar2 | (in_stack_ffffffffffffffd8->u).s.info & 0xffff0000;
    BVar1 = bcemit_jmp((FuncState *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  }
  else {
    if (in_RSI[2] != 0xc) {
      bcreg_reserve((FuncState *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                    (BCReg)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
      expr_toreg_nobranch((FuncState *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                          ,(ExpDesc *)in_RDI,(BCReg)((ulong)in_RSI >> 0x20));
    }
    bcemit_INS(in_RDI,(BCIns)((ulong)in_RSI >> 0x20));
    BVar1 = bcemit_jmp((FuncState *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
    expr_free((FuncState *)CONCAT44(in_EDX,BVar1),in_stack_ffffffffffffffd8);
  }
  return BVar1;
}

Assistant:

static BCPos bcemit_branch(FuncState *fs, ExpDesc *e, int cond)
{
  BCPos pc;
  if (e->k == VRELOCABLE) {
    BCIns *ip = bcptr(fs, e);
    if (bc_op(*ip) == BC_NOT) {
      *ip = BCINS_AD(cond ? BC_ISF : BC_IST, 0, bc_d(*ip));
      return bcemit_jmp(fs);
    }
  }
  if (e->k != VNONRELOC) {
    bcreg_reserve(fs, 1);
    expr_toreg_nobranch(fs, e, fs->freereg-1);
  }
  bcemit_AD(fs, cond ? BC_ISTC : BC_ISFC, NO_REG, e->u.s.info);
  pc = bcemit_jmp(fs);
  expr_free(fs, e);
  return pc;
}